

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_path_absolute_or_empty
          (char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  size_t sVar1;
  curi_status local_3c;
  curi_status status;
  size_t initialOffset;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  sVar1 = *offset;
  local_3c = parse_segments(uri,len,offset,settings,userData);
  if (local_3c == curi_status_success) {
    local_3c = handle_path(uri + sVar1,*offset - sVar1,settings,userData);
  }
  return local_3c;
}

Assistant:

static curi_status parse_path_absolute_or_empty(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // path-absolute-or-empty  = segments
    const size_t initialOffset = *offset;

    curi_status status = parse_segments(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = handle_path(uri + initialOffset, *offset - initialOffset, settings, userData);

    return status;
}